

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satelite.cpp
# Opt level: O2

void __thiscall Clasp::SatElite::doExtendModel(SatElite *this,ValueVec *m,LitVec *unconstr)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  pointer pLVar4;
  byte bVar5;
  uint uVar6;
  long lVar7;
  pointer first;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  Clause *pCVar12;
  uint uVar13;
  Literal local_34;
  
  pCVar12 = (this->super_SatPreprocessor).elimTop_;
  if (pCVar12 != (Clause *)0x0) {
    uVar10 = (unconstr->ebo_).size;
    uVar13 = 0;
    do {
      uVar1 = pCVar12->lits_[0].rep_;
      uVar6 = uVar1 >> 2;
      if (-1 < *(int *)&pCVar12->field_0x8) {
        (m->ebo_).buf[uVar6] = '\x04';
      }
      bVar5 = 1;
      uVar8 = uVar1;
      uVar9 = uVar10;
      if ((uVar13 != uVar10) &&
         (uVar2 = (unconstr->ebo_).buf[uVar13].rep_, uVar9 = uVar13, uVar2 >> 2 == uVar6)) {
        (m->ebo_).buf[uVar6] = '\x02' - ((uVar2 & 2) == 0);
        bVar5 = 0;
        uVar9 = uVar13 + 1;
      }
      do {
        uVar13 = uVar9;
        puVar3 = (m->ebo_).buf;
        if ((bool)(puVar3[uVar8 >> 2] != (uchar)('\x02' - ((uVar8 & 2) == 0)) & bVar5)) {
          uVar11 = 1;
          do {
            uVar9 = uVar8;
            if ((*(uint *)&pCVar12->field_0x8 & 0x3fffffff) == (uint)uVar11) break;
            uVar9 = pCVar12->lits_[uVar11].rep_;
            uVar11 = (ulong)((uint)uVar11 + 1);
          } while ((byte)(puVar3[uVar9 >> 2] & 3) == (byte)(((uVar9 & 2) == 0) + 1U));
          bVar5 = 1;
          if ((pCVar12->lits_[0].rep_ ^ uVar9) < 2) {
            puVar3[uVar9 >> 2] = '\x02' - ((uVar9 & 2) == 0);
            bVar5 = 0;
          }
        }
        pCVar12 = (pCVar12->data_).next;
      } while ((pCVar12 != (Clause *)0x0) &&
              (uVar8 = pCVar12->lits_[0].rep_, uVar9 = uVar13, uVar8 >> 2 == uVar6));
      puVar3 = (m->ebo_).buf;
      if (puVar3[uVar6] == '\x04') {
        puVar3[uVar6] = '\x05';
        local_34.rep_ = uVar1 & 0xfffffffc;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (unconstr,&local_34);
      }
    } while (pCVar12 != (Clause *)0x0);
    pLVar4 = (unconstr->ebo_).buf;
    first = pLVar4 + uVar10;
    uVar13 = (unconstr->ebo_).size;
    for (lVar7 = (ulong)uVar10 * 4; (ulong)uVar13 << 2 != lVar7; lVar7 = lVar7 + 4) {
      uVar10 = *(uint *)((long)&pLVar4->rep_ + lVar7) >> 2;
      puVar3 = (m->ebo_).buf;
      if ((puVar3[uVar10] & 4) != 0) {
        puVar3[uVar10] = '\x01';
        first->rep_ = *(uint32 *)((long)&pLVar4->rep_ + lVar7);
        first = first + 1;
      }
    }
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::erase
              (unconstr,first,(unconstr->ebo_).buf + (unconstr->ebo_).size);
  }
  return;
}

Assistant:

void SatElite::doExtendModel(ValueVec& m, LitVec& unconstr) {
	if (!elimTop_) return;
	const ValueRep value_eliminated = 4u;
	// compute values of eliminated vars / blocked literals by "unit propagating"
	// eliminated/blocked clauses in reverse order
	uint32 uv = 0;
	uint32 us = unconstr.size();
	Clause* r = elimTop_;
	do {
		Literal x  = (*r)[0];
		Var last   = x.var();
		bool check = true;
		if (!r->marked()) {
			// eliminated var - compute the implied value
			m[last] = value_eliminated;
		}
		if (uv != us && unconstr[uv].var() == last) {
			// last is unconstrained w.r.t the current model -
			// set remembered value
			check   = false;
			m[last] = trueValue(unconstr[uv]);
			++uv;
		}
		do {
			Clause& c = *r;
			if (m[x.var()] != trueValue(x) && check) {
				for (uint32 i = 1, end = c.size(); i != end; ++i) {
					ValueRep vi = m[c[i].var()] & 3u;
					if (vi != falseValue(c[i])) {
						x = c[i];
						break;
					}
				}
				if (x == c[0]) {
					// all lits != x are false
					// clause is unit or conflicting
					assert(c.marked() || m[x.var()] != falseValue(x));
					m[x.var()] = trueValue(x);
					check      = false;
				}
			}
			r = r->next();
		} while (r && (x = (*r)[0]).var() == last);
		if (m[last] == value_eliminated) {
			// last seems unconstrained w.r.t the model
			m[last] |= value_true;
			unconstr.push_back(posLit(last));
		}
	} while (r);
	// check whether newly added unconstrained vars are really unconstrained w.r.t the model
	// or if they are implied by some blocked clause.
	LitVec::iterator j = unconstr.begin()+us;
	for (LitVec::iterator it = j, end = unconstr.end(); it != end; ++it) {
		if ((m[it->var()] & value_eliminated) != 0) {
			// var is unconstrained - assign to true and remember it
			// so that we can later enumerate the model containing ~var
			m[it->var()] = value_true;
			*j++ = *it;
		}
	}
	unconstr.erase(j, unconstr.end());
}